

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptelement.cpp
# Opt level: O2

void __thiscall
ScriptElement_OpNumTypeConstructor_Test::TestBody(ScriptElement_OpNumTypeConstructor_Test *this)

{
  ScriptOperator *rhs;
  char *pcVar1;
  char *in_R9;
  bool bVar2;
  AssertionResult gtest_ar_5;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_f0;
  AssertionResult gtest_ar;
  allocator local_b1;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_b0;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_4;
  ScriptElement op_elem;
  
  cfd::core::ScriptElement::ScriptElement
            (&op_elem,(ScriptOperator *)cfd::core::ScriptOperator::OP_12);
  gtest_ar_5._0_8_ = (ulong)(uint)gtest_ar_5._4_4_ << 0x20;
  local_f0._M_impl.super__Vector_impl_data._M_start._0_4_ =
       cfd::core::ScriptElement::GetType(&op_elem);
  testing::internal::CmpHelperEQ<cfd::core::ScriptElementType,cfd::core::ScriptElementType>
            ((internal *)&gtest_ar,"ScriptElementType::kElementOpCode","op_elem.GetType()",
             (ScriptElementType *)&gtest_ar_5,(ScriptElementType *)&local_f0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_scriptelement.cpp"
               ,0x1e,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_5);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  rhs = cfd::core::ScriptElement::GetOpCode(&op_elem);
  testing::internal::CmpHelperEQ<cfd::core::ScriptOperator,cfd::core::ScriptOperator>
            ((internal *)&gtest_ar,"ScriptOperator::OP_12","op_elem.GetOpCode()",
             (ScriptOperator *)cfd::core::ScriptOperator::OP_12,rhs);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_scriptelement.cpp"
               ,0x1f,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_5);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ByteData::ByteData((ByteData *)&gtest_ar_5);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar,
             (ByteData *)&gtest_ar_5);
  cfd::core::ScriptElement::GetBinaryData((ByteData *)&local_b0,&op_elem);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f0,
             (ByteData *)&local_b0);
  testing::internal::
  CmpHelperEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((internal *)&gtest_ar_2,"ByteData().GetBytes()","op_elem.GetBinaryData().GetBytes()",
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_f0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_b0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_5);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_scriptelement.cpp"
               ,0x20,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  local_f0._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xc;
  gtest_ar_5._0_8_ = cfd::core::ScriptElement::GetNumber(&op_elem);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"12","op_elem.GetNumber()",(int *)&local_f0,(long *)&gtest_ar_5);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_scriptelement.cpp"
               ,0x21,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_5);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&gtest_ar,"5c",&local_b1);
  cfd::core::ByteData::ByteData((ByteData *)&local_f0,(string *)&gtest_ar);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_5,
             (ByteData *)&local_f0);
  cfd::core::ScriptElement::GetData((ByteData *)&gtest_ar_2,&op_elem);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b0,
             (ByteData *)&gtest_ar_2);
  testing::internal::
  CmpHelperEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((internal *)&gtest_ar_4,"ByteData(\"5c\").GetBytes()","op_elem.GetData().GetBytes()",
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_5,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_b0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_5);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_f0);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_scriptelement.cpp"
               ,0x22,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  cfd::core::ScriptElement::ToString_abi_cxx11_((string *)&gtest_ar,&op_elem);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_5,"\"12\"","op_elem.ToString().c_str()","12",
             (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_5.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_scriptelement.cpp"
               ,0x23,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_5.message_);
  gtest_ar_5.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  bVar2 = op_elem.type_ != kElementBinary;
  gtest_ar_5.success_ = bVar2;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_5,(AssertionResult *)"op_elem.IsBinary()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_scriptelement.cpp"
               ,0x24,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_5.message_);
  if ((op_elem.type_ == kElementNumber) || (op_elem.value_ != 0)) {
    gtest_ar_5.success_ = true;
    gtest_ar_5.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    gtest_ar_5.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar_5.success_ = op_elem.op_code_.data_type_ == kOpFalse;
    if (!gtest_ar_5.success_) {
      testing::Message::Message((Message *)&local_f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_5,(AssertionResult *)"op_elem.IsNumber()"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_scriptelement.cpp"
                 ,0x25,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_f0);
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_5.message_);
  gtest_ar_5.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  gtest_ar_5.success_ = op_elem.type_ == kElementOpCode;
  if (op_elem.type_ != kElementOpCode) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_5,(AssertionResult *)"op_elem.IsOpCode()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_scriptelement.cpp"
               ,0x26,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_5.message_);
  cfd::core::ScriptElement::~ScriptElement(&op_elem);
  return;
}

Assistant:

TEST(ScriptElement, OpNumTypeConstructor) {
  ScriptElement op_elem = ScriptElement(ScriptOperator::OP_12);

  EXPECT_EQ(ScriptElementType::kElementOpCode, op_elem.GetType());
  EXPECT_EQ(ScriptOperator::OP_12, op_elem.GetOpCode());
  EXPECT_EQ(ByteData().GetBytes(), op_elem.GetBinaryData().GetBytes());
  EXPECT_EQ(12, op_elem.GetNumber());
  EXPECT_EQ(ByteData("5c").GetBytes(), op_elem.GetData().GetBytes());
  EXPECT_STREQ("12", op_elem.ToString().c_str());
  EXPECT_FALSE(op_elem.IsBinary());
  EXPECT_TRUE(op_elem.IsNumber());
  EXPECT_TRUE(op_elem.IsOpCode());
}